

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O2

void addFacesToMesh(aiMesh *pMesh)

{
  aiFace *paVar1;
  ulong *puVar2;
  aiFace *paVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint i;
  ulong uVar8;
  
  uVar7 = (ulong)pMesh->mNumFaces;
  puVar2 = (ulong *)operator_new__(uVar7 * 0x10 + 8);
  paVar1 = (aiFace *)(puVar2 + 1);
  *puVar2 = uVar7;
  if (uVar7 != 0) {
    paVar3 = paVar1;
    do {
      paVar3->mNumIndices = 0;
      paVar3->mIndices = (uint *)0x0;
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1 + uVar7);
  }
  pMesh->mFaces = paVar1;
  iVar6 = 0;
  for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
    paVar1 = pMesh->mFaces;
    paVar1[uVar8].mNumIndices = 3;
    puVar4 = (uint *)operator_new__(0xc);
    paVar1[uVar8].mIndices = puVar4;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      paVar1[uVar8].mIndices[lVar5] = iVar6 + (int)lVar5;
    }
    uVar7 = (ulong)pMesh->mNumFaces;
    iVar6 = iVar6 + 3;
  }
  return;
}

Assistant:

void addFacesToMesh(aiMesh* pMesh)
{
    pMesh->mFaces = new aiFace[pMesh->mNumFaces];
    for (unsigned int i = 0, p = 0; i < pMesh->mNumFaces;++i)    {

        aiFace& face = pMesh->mFaces[i];
        face.mIndices = new unsigned int[face.mNumIndices = 3];
        for (unsigned int o = 0; o < 3;++o,++p) {
            face.mIndices[o] = p;
        }
    }
}